

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O3

void __thiscall
helics::apps::Connector::makeConnections(Connector *this,ConnectionsList *possibleConnections)

{
  element_type *peVar1;
  _func_int *p_Var2;
  uint uVar3;
  int iVar4;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 in_R9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var5;
  string_view fmt;
  string_view message;
  format_args args;
  _Any_data local_78;
  code *local_68;
  code *local_60;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_58;
  Time local_50;
  _Alloc_hider local_48;
  
  peVar1 = (this->super_App).fed.
           super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (peVar1->super_ValueFederate)._vptr_ValueFederate[-3];
  uVar3 = (**(code **)(*(long *)((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate +
                                (long)p_Var2) + 0x48))
                    ((_func_int *)
                     ((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate + (long)p_Var2),0x10f
                    );
  local_50.internalTimeCode = (baseType)&possibleConnections->tagCodes;
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (possibleConnections->unconnectedInputs).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (possibleConnections->unconnectedInputs).
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var5 != local_58._M_pi) {
    do {
      local_78._12_4_ = 0;
      local_78._8_4_ = uVar3;
      local_60 = CLI::std::
                 _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1193:27)>
                 ::_M_invoke;
      local_68 = CLI::std::
                 _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1193:27)>
                 ::_M_manager;
      in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
              possibleConnections;
      local_78._M_unused._M_object = this;
      iVar4 = makeTargetConnection
                        (this,(string_view)*p_Var5,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         local_50.internalTimeCode,&possibleConnections->pubs,
                         &possibleConnections->aliases,
                         (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)&local_78);
      this->matchCount = this->matchCount + (long)iVar4;
      if ((_func_int **)local_68 != (_func_int **)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      p_Var5 = p_Var5 + 1;
    } while (p_Var5 != local_58._M_pi);
  }
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (possibleConnections->unconnectedPubs).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (possibleConnections->unconnectedPubs).
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var5 != local_58._M_pi) {
    do {
      local_78._12_4_ = 0;
      local_78._8_4_ = uVar3;
      local_60 = CLI::std::
                 _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1200:25)>
                 ::_M_invoke;
      local_68 = CLI::std::
                 _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1200:25)>
                 ::_M_manager;
      in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
              possibleConnections;
      local_78._M_unused._M_object = this;
      iVar4 = makeTargetConnection
                        (this,(string_view)*p_Var5,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         local_50.internalTimeCode,&possibleConnections->inputs,
                         &possibleConnections->aliases,
                         (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)&local_78);
      this->matchCount = this->matchCount + (long)iVar4;
      if ((_func_int **)local_68 != (_func_int **)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      p_Var5 = p_Var5 + 1;
    } while (p_Var5 != local_58._M_pi);
  }
  p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           (possibleConnections->unconnectedSourceEndpoints).
           super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  local_58._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       (possibleConnections->unconnectedSourceEndpoints).
       super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (p_Var5 != local_58._M_pi) {
    do {
      local_78._12_4_ = 0;
      local_78._8_4_ = uVar3;
      local_60 = CLI::std::
                 _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1207:36)>
                 ::_M_invoke;
      local_68 = CLI::std::
                 _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1207:36)>
                 ::_M_manager;
      in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
              possibleConnections;
      local_78._M_unused._M_object = this;
      iVar4 = makeTargetConnection
                        (this,(string_view)*p_Var5,
                         (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                         local_50.internalTimeCode,&possibleConnections->endpoints,
                         &possibleConnections->aliases,
                         (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                          *)&local_78);
      this->matchCount = this->matchCount + (long)iVar4;
      if ((_func_int **)local_68 != (_func_int **)0x0) {
        (*local_68)(&local_78,&local_78,3);
      }
      p_Var5 = p_Var5 + 1;
    } while (p_Var5 != local_58._M_pi);
  }
  if (this->matchTargetEndpoints != false) {
    p_Var5 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             (possibleConnections->unconnectedTargetEndpoints).
             super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    local_58._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         (possibleConnections->unconnectedTargetEndpoints).
         super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (p_Var5 != local_58._M_pi) {
      do {
        local_78._12_4_ = 0;
        local_78._8_4_ = uVar3;
        local_60 = CLI::std::
                   _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1217:36)>
                   ::_M_invoke;
        local_68 = CLI::std::
                   _Function_handler<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/GMLC-TDC[P]HELICS/src/helics/apps/Connector.cpp:1217:36)>
                   ::_M_manager;
        in_R9 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2)
                possibleConnections;
        local_78._M_unused._M_object = this;
        iVar4 = makeTargetConnection
                          (this,(string_view)*p_Var5,
                           (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                           local_50.internalTimeCode,&possibleConnections->endpoints,
                           &possibleConnections->aliases,
                           (function<void_(std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>)>
                            *)&local_78);
        this->matchCount = this->matchCount + (long)iVar4;
        if ((_func_int **)local_68 != (_func_int **)0x0) {
          (*local_68)(&local_78,&local_78,3);
        }
        p_Var5 = p_Var5 + 1;
      } while (p_Var5 != local_58._M_pi);
    }
  }
  if (5 < (int)uVar3) {
    peVar1 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    p_Var2 = (peVar1->super_ValueFederate)._vptr_ValueFederate[-3];
    local_48._M_p = (pointer)this->matchCount;
    fmt.size_ = 4;
    fmt.data_ = (char *)0x13;
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)&stack0xffffffffffffffb8;
    ::fmt::v11::vformat_abi_cxx11_((string *)&local_78,(v11 *)"{} connections made",fmt,args);
    message._M_str = (char *)local_78._M_unused._0_8_;
    message._M_len = local_78._8_8_;
    Federate::logMessage
              ((Federate *)((long)&(peVar1->super_ValueFederate)._vptr_ValueFederate + (long)p_Var2)
               ,6,message);
    if ((Connector *)local_78._M_unused._0_8_ != (Connector *)&stack0xffffffffffffff98) {
      operator_delete(local_78._M_unused._M_object,(ulong)((long)local_68 + 1));
    }
  }
  return;
}

Assistant:

void Connector::makeConnections(ConnectionsList& possibleConnections)
{
    const int logLevel = fed->getIntegerProperty(HELICS_PROPERTY_INT_LOG_LEVEL);
    auto inputConnector = [this, logLevel](std::string_view target, std::string_view source) {
        core.dataLink(source, target);
        if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
            fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                            fmt::format("connecting input {} to publication {}", target, source));
        }
    };
    auto pubConnector = [this, logLevel](std::string_view source, std::string_view target) {
        core.dataLink(source, target);
        if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
            fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                            fmt::format("connecting publication {} to input {}", source, target));
        }
    };
    auto sourceEndpointConnector = [this, logLevel](std::string_view source,
                                                    std::string_view target) {
        core.linkEndpoints(source, target);
        if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
            fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                            fmt::format("connecting source endpoint {} to target endpoint {}",
                                        source,
                                        target));
        }
    };
    auto targetEndpointConnector = [this, logLevel](std::string_view target,
                                                    std::string_view source) {
        core.linkEndpoints(source, target);
        if (logLevel >= HELICS_LOG_LEVEL_CONNECTIONS) {
            fed->logMessage(HELICS_LOG_LEVEL_CONNECTIONS,
                            fmt::format("connecting target endpoint {} to source endpoint {}",
                                        target,
                                        source));
        }
    };

    const auto& tagList = possibleConnections.tagCodes;
    /** unconnected inputs*/
    for (const auto& uInp : possibleConnections.unconnectedInputs) {
        matchCount += makeTargetConnection(
            uInp, tagList, possibleConnections.pubs, possibleConnections.aliases, inputConnector);
    }
    /** unconnected publications*/
    for (const auto& uPub : possibleConnections.unconnectedPubs) {
        matchCount += makeTargetConnection(
            uPub, tagList, possibleConnections.inputs, possibleConnections.aliases, pubConnector);
    }

    /** unconnected source endpoints*/
    for (const auto& uEnd : possibleConnections.unconnectedSourceEndpoints) {
        matchCount += makeTargetConnection(uEnd,
                                           tagList,
                                           possibleConnections.endpoints,
                                           possibleConnections.aliases,
                                           sourceEndpointConnector);
    }

    if (matchTargetEndpoints) {
        /** unconnected target endpoints*/
        for (const auto& uEnd : possibleConnections.unconnectedTargetEndpoints) {
            matchCount += makeTargetConnection(uEnd,
                                               tagList,
                                               possibleConnections.endpoints,
                                               possibleConnections.aliases,
                                               targetEndpointConnector);
        }
    }
    if (logLevel >= HELICS_LOG_LEVEL_SUMMARY) {
        fed->logInfoMessage(fmt::format("{} connections made", matchCount));
    }
}